

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstantBound.cpp
# Opt level: O3

void TPZShapeHDivConstantBound<pzshape::TPZShapeTriang>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  TPZVec<double> qsi;
  TPZFMatrix<double> phiAux;
  TPZVec<double> local_170;
  TPZFMatrix<double> local_150;
  TPZFMatrix<double> local_c0;
  
  pztopology::TPZTriangle::NumSides(1);
  TPZShapeH1<pzshape::TPZShapeTriang>::Shape(pt,data);
  dVar7 = (double)*(data->fSideOrient).super_TPZVec<int>.fStore;
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *phi->fElem = dVar7 + dVar7;
  iVar3 = TPZShapeHCurlNoGrads<pzshape::TPZShapeTriang>::NHCurlShapeF(data);
  lVar5 = (long)iVar3;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_c0.fElem = (double *)0x0;
  local_c0.fGiven = (double *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar5;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_c0.fWork.fStore = (double *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  if (iVar3 != 0) {
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar3) {
      uVar6 = lVar5 << 4;
    }
    local_c0.fElem = (double *)operator_new__(uVar6);
  }
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_150.fElem = (double *)0x0;
  local_150.fGiven = (double *)0x0;
  local_150.fSize = 0;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar5;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_150.fWork.fStore = (double *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  if (iVar3 != 0) {
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar3) {
      uVar6 = lVar5 << 3;
    }
    local_150.fElem = (double *)operator_new__(uVar6);
  }
  memset(local_150.fElem,0,
         local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
         local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
       local_150.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
  TPZVec<double>::TPZVec(&local_170,pt);
  TPZShapeHCurlNoGrads<pzshape::TPZShapeTriang>::Shape(&local_170,data,&local_c0,&local_150);
  iVar4 = pztopology::TPZTriangle::NumSides(1);
  if (iVar4 < iVar3) {
    lVar5 = 0;
    do {
      lVar2 = lVar5 + iVar4;
      if (((local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) || (lVar2 < 0)) ||
         (local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar2)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = lVar5 + 1;
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar1) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      phi->fElem[lVar5 + 1] =
           local_150.fElem[local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar2];
      lVar5 = lVar1;
    } while (iVar3 - iVar4 != (int)lVar1);
  }
  local_170._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  if (local_170.fStore != (double *)0x0) {
    operator_delete__(local_170.fStore);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_150);
  TPZFMatrix<double>::~TPZFMatrix(&local_c0);
  return;
}

Assistant:

void TPZShapeHDivConstantBound<TSHAPE>::Shape(const TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi) {

    const int ncorner = TSHAPE::NCornerNodes;
    const int nsides = TSHAPE::NSides;
    const int dim = TSHAPE::Dimension;
    const auto nEdges = TSHAPE::NumSides(1);
    TPZShapeH1<TSHAPE>::Shape(pt,data);

    if (dim == 1){
        phi(0,0) = 0.5 * data.fSideOrient[0];

        int nshape = data.fPhi.Rows();

        for (int i = 0; i < nshape-ncorner; i++){
            phi(i+1,0) = -data.fDPhi(0,i+ncorner);
        }
    } else if (dim == 2) {
        
        
        if (TSHAPE::Type() == EQuadrilateral){
            phi(0,0) = 0.25 * data.fSideOrient[0];
        } else if (TSHAPE::Type() == ETriangle){
            phi(0,0) = 2. * data.fSideOrient[0];
        }

        int nshape = TPZShapeHCurlNoGrads<TSHAPE>::NHCurlShapeF(data);

        TPZFMatrix<REAL> phiAux(2,nshape),curlPhiAux(1,nshape);
        curlPhiAux.Zero();
        auto qsi = pt;
        TPZShapeHCurlNoGrads<TSHAPE>::Shape(qsi,data,phiAux,curlPhiAux);

        auto nEdges = TSHAPE::NumSides(1); 
       
        for (int i = nEdges; i < nshape; i++)
        {
            phi(i-nEdges+1,0) = curlPhiAux(0,i);
        }
        
    } else {
        DebugStop();
    }


}